

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O1

void __thiscall
spirv_cross::CompilerGLSL::emit_declared_builtin_block
          (CompilerGLSL *this,StorageClass storage,ExecutionModel model)

{
  int iVar1;
  uint uVar2;
  mapped_type mVar3;
  BuiltIn BVar4;
  size_t sVar5;
  Variant *pVVar6;
  Decoration *pDVar7;
  _Hash_node_base *p_Var8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  uint3 uVar11;
  __node_base_ptr p_Var12;
  bool bVar13;
  bool bVar14;
  uint32_t uVar15;
  uint32_t uVar16;
  ExecutionModel EVar17;
  SPIRType *pSVar18;
  mapped_type *pmVar19;
  mapped_type *pmVar20;
  undefined4 extraout_var;
  undefined8 uVar21;
  undefined4 extraout_var_01;
  _Hash_node_base *p_Var22;
  __node_base_ptr p_Var23;
  SPIREntryPoint *pSVar24;
  runtime_error *prVar25;
  char *ts_1;
  char (*ts_1_00) [3];
  TypedID<(spirv_cross::Types)0> *pTVar26;
  _Hash_node_base *p_Var27;
  ulong uVar28;
  SPIRVariable *pSVar29;
  TypedID<(spirv_cross::Types)0> *pTVar30;
  __node_base_ptr p_Var31;
  __node_base_ptr in_R9;
  byte bVar32;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *elem;
  ID *__k;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar33;
  uint uVar34;
  StorageClass SVar35;
  long lVar36;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar37;
  uint32_t geom_stream;
  uint32_t xfb_buffer;
  uint32_t xfb_stride;
  uint32_t clip_distance_size;
  uint32_t cull_distance_size;
  unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
  builtin_xfb_offsets;
  Bitset emitted_builtins;
  SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
  attr;
  Bitset global_builtins;
  Bitset builtins;
  uint32_t local_139c;
  uint32_t local_1398;
  uint32_t local_1394;
  uint local_1390;
  uint local_138c;
  ulong local_1388;
  SPIRVariable *local_1380;
  StorageClass local_1378;
  BuiltIn local_1374;
  SPIRType *local_1370;
  ulong local_1368;
  SPIRVariable *local_1360;
  ulong local_1358;
  undefined8 local_1350;
  ExecutionModel local_1344;
  ulong local_1340;
  _Map_base<spirv_cross::TypedID<(spirv_cross::Types)0>,_std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>,_std::__detail::_Select1st,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
  *local_1338;
  TypedID<(spirv_cross::Types)0> *local_1330;
  TypedID<(spirv_cross::Types)0> *local_1328;
  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  local_1320;
  string local_12e8;
  pointer local_12c8;
  _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  local_12c0;
  undefined1 local_1288 [24];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1270 [8];
  pointer local_1168;
  undefined1 local_1160 [32];
  float local_1140;
  size_t local_1138;
  __node_base_ptr p_Stack_1130;
  undefined1 local_1128 [8];
  undefined1 auStack_1120 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1110;
  float local_1100;
  size_t local_10f8;
  __node_base_ptr ap_Stack_10f0 [508];
  Buffer *local_110;
  size_t sStack_108;
  size_t local_100;
  Buffer local_f8 [8];
  undefined4 extraout_var_00;
  
  local_12c8 = (pointer)0x0;
  local_12c0._M_buckets = &local_12c0._M_single_bucket;
  local_12c0._M_bucket_count = 1;
  local_12c0._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_12c0._M_element_count = 0;
  local_12c0._M_rehash_policy._M_max_load_factor = 1.0;
  local_12c0._M_rehash_policy._M_next_resize = 0;
  local_12c0._M_single_bucket = (__node_base_ptr)0x0;
  local_1168 = (pointer)0x0;
  local_1160._0_8_ = &p_Stack_1130;
  local_1160._8_8_ = 1;
  local_1160._16_8_ = 0;
  local_1160._24_8_ = 0;
  local_1140 = 1.0;
  local_1138 = 0;
  p_Stack_1130 = (__node_base_ptr)0x0;
  local_138c = 0;
  local_1390 = 0;
  local_1394 = 0;
  local_1398 = 0;
  local_139c = 0;
  local_1320._M_buckets = &local_1320._M_single_bucket;
  local_1320._M_bucket_count = 1;
  local_1320._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_1320._M_element_count = 0;
  local_1320._M_rehash_policy._M_max_load_factor = 1.0;
  local_1320._M_rehash_policy._M_next_resize = 0;
  local_1320._M_single_bucket = (__node_base_ptr)0x0;
  local_1344 = model;
  ParsedIR::create_loop_hard_lock(&(this->super_Compiler).ir);
  sVar5 = (this->super_Compiler).ir.ids_for_type[2].
          super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>.buffer_size;
  local_1378 = storage;
  if (sVar5 == 0) {
    bVar32 = 1;
    local_1388 = 0;
    uVar28 = 0;
    local_1358 = 0;
    local_1360 = (SPIRVariable *)0x0;
  }
  else {
    pTVar26 = (this->super_Compiler).ir.ids_for_type[2].
              super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>.ptr;
    pTVar30 = pTVar26 + sVar5;
    local_1338 = (_Map_base<spirv_cross::TypedID<(spirv_cross::Types)0>,_std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>,_std::__detail::_Select1st,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                  *)&(this->super_Compiler).ir.meta;
    local_1350 = 0;
    local_1388 = 0;
    local_1368 = 0;
    uVar28 = 0;
    local_1358 = 0;
    local_1360 = (SPIRVariable *)0x0;
    local_1330 = pTVar30;
    do {
      pVVar6 = (this->super_Compiler).ir.ids.super_VectorView<spirv_cross::Variant>.ptr;
      if (pVVar6[pTVar26->id].type == TypeVariable) {
        local_1328 = pTVar26;
        local_1380 = Variant::get<spirv_cross::SPIRVariable>(pVVar6 + pTVar26->id);
        pSVar18 = Variant::get<spirv_cross::SPIRType>
                            ((this->super_Compiler).ir.ids.super_VectorView<spirv_cross::Variant>.
                             ptr + *(uint *)&(local_1380->super_IVariant).field_0xc);
        bVar13 = Compiler::has_decoration
                           (&this->super_Compiler,(ID)(pSVar18->super_IVariant).self.id,
                            DecorationBlock);
        local_1128 = (undefined1  [8])0x0;
        auStack_1120._0_8_ = ap_Stack_10f0;
        auStack_1120._8_8_ = 1;
        local_1110._0_8_ = 0;
        local_1110._8_8_ = 0;
        local_1100 = 1.0;
        local_10f8 = 0;
        ap_Stack_10f0[0] = (__node_base_ptr)0x0;
        local_1370 = pSVar18;
        if ((bVar13 && local_1380->storage == storage) &&
           (bVar14 = Compiler::is_builtin_variable(&this->super_Compiler,local_1380), bVar14)) {
          pmVar19 = ::std::__detail::
                    _Map_base<spirv_cross::TypedID<(spirv_cross::Types)0>,_std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>,_std::__detail::_Select1st,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                    ::operator[](local_1338,&(local_1370->super_IVariant).self);
          sVar5 = (pmVar19->members).super_VectorView<spirv_cross::Meta::Decoration>.buffer_size;
          local_1340 = uVar28;
          if (sVar5 != 0) {
            pDVar7 = (pmVar19->members).super_VectorView<spirv_cross::Meta::Decoration>.ptr;
            lVar36 = 0;
            uVar34 = 0;
            do {
              if (*(char *)((long)(pDVar7->extended).values + lVar36 + -0x44) == '\x01') {
                local_1374 = *(BuiltIn *)((long)(pDVar7->extended).values + lVar36 + -0x80);
                if (local_1374 < 0x40) {
                  local_1128 = (undefined1  [8])
                               ((ulong)local_1128 | 1L << ((byte)local_1374 & 0x3f));
                }
                else {
                  local_1288._0_8_ =
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       auStack_1120;
                  ::std::
                  _Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                  ::
                  _M_insert<unsigned_int_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<unsigned_int,false>>>>
                            ((_Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                              *)auStack_1120,&local_1374,local_1288);
                }
                iVar1 = *(int *)((long)(pDVar7->extended).values + lVar36 + -0x80);
                if (iVar1 == 3) {
                  pSVar18 = Variant::get<spirv_cross::SPIRType>
                                      ((this->super_Compiler).ir.ids.
                                       super_VectorView<spirv_cross::Variant>.ptr +
                                       (local_1370->member_types).
                                       super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>
                                       .ptr[uVar34].id);
                  local_1390 = to_array_size_literal
                                         (this,pSVar18,
                                          (int)(pSVar18->array).super_VectorView<unsigned_int>.
                                               buffer_size - 1);
                }
                else if (iVar1 == 4) {
                  pSVar18 = Variant::get<spirv_cross::SPIRType>
                                      ((this->super_Compiler).ir.ids.
                                       super_VectorView<spirv_cross::Variant>.ptr +
                                       (local_1370->member_types).
                                       super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>
                                       .ptr[uVar34].id);
                  local_138c = to_array_size_literal
                                         (this,pSVar18,
                                          (int)(pSVar18->array).super_VectorView<unsigned_int>.
                                               buffer_size - 1);
                }
                uVar2 = *(uint *)((long)(pDVar7->extended).values + lVar36 + -0x80);
                if (((uVar2 < 5) && (uVar2 != 2)) &&
                   ((*(byte *)((long)&(pDVar7->decoration_flags).lower + lVar36 + 4) & 8) != 0)) {
                  mVar3 = *(mapped_type *)((long)(pDVar7->extended).values + lVar36 + -0x6c);
                  local_1288._0_4_ = uVar2;
                  pmVar20 = ::std::__detail::
                            _Map_base<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                            ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                          *)&local_1320,(key_type *)local_1288);
                  *pmVar20 = mVar3;
                  local_1350 = CONCAT71((int7)((ulong)pmVar20 >> 8),1);
                }
                uVar2 = *(uint *)((long)(pDVar7->extended).values + lVar36 + -0x80);
                if (((uVar2 < 5) && (uVar2 != 2)) &&
                   ((*(byte *)((long)&(pDVar7->decoration_flags).lower + lVar36 + 3) & 0x20) != 0))
                {
                  uVar15 = *(uint32_t *)((long)(pDVar7->extended).values + lVar36 + -0x60);
                  if (((local_1388 & 1) != 0) && (local_139c != uVar15)) {
                    prVar25 = (runtime_error *)__cxa_allocate_exception(0x10);
                    local_1288._0_8_ = local_1288 + 0x10;
                    ::std::__cxx11::string::_M_construct<char_const*>
                              ((string *)local_1288,"IO block member Stream mismatch.","");
                    ::std::runtime_error::runtime_error(prVar25,(string *)local_1288);
                    *(undefined ***)prVar25 = &PTR__runtime_error_0035b0b8;
                    __cxa_throw(prVar25,&CompilerError::typeinfo,
                                ::std::runtime_error::~runtime_error);
                  }
                  local_1388 = CONCAT71((uint7)(uint3)(uVar15 >> 8),1);
                  local_139c = uVar15;
                }
              }
              uVar34 = uVar34 + 1;
              lVar36 = lVar36 + 0x160;
            } while (sVar5 * 0x160 - lVar36 != 0);
          }
          storage = local_1378;
          pSVar29 = local_1380;
          uVar28 = local_1340;
          if (((local_1378 == StorageClassOutput) &&
              (bVar13 = Compiler::has_decoration
                                  (&this->super_Compiler,(ID)(local_1380->super_IVariant).self.id,
                                   DecorationXfbBuffer), uVar28 = local_1340, bVar13)) &&
             (bVar13 = Compiler::has_decoration
                                 (&this->super_Compiler,(ID)(pSVar29->super_IVariant).self.id,
                                  DecorationXfbStride), bVar13)) {
            uVar15 = Compiler::get_decoration
                               (&this->super_Compiler,(ID)(pSVar29->super_IVariant).self.id,
                                DecorationXfbBuffer);
            uVar16 = Compiler::get_decoration
                               (&this->super_Compiler,(ID)(pSVar29->super_IVariant).self.id,
                                DecorationXfbStride);
            if ((local_1368 & 1) != 0) {
              if (uVar15 != local_1398) {
                prVar25 = (runtime_error *)__cxa_allocate_exception(0x10);
                local_1288._0_8_ = local_1288 + 0x10;
                ::std::__cxx11::string::_M_construct<char_const*>
                          ((string *)local_1288,"IO block member XfbBuffer mismatch.","");
                ::std::runtime_error::runtime_error(prVar25,(string *)local_1288);
                *(undefined ***)prVar25 = &PTR__runtime_error_0035b0b8;
                __cxa_throw(prVar25,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
              }
              if (uVar16 != local_1394) {
                prVar25 = (runtime_error *)__cxa_allocate_exception(0x10);
                local_1288._0_8_ = local_1288 + 0x10;
                ::std::__cxx11::string::_M_construct<char_const*>
                          ((string *)local_1288,"IO block member XfbBuffer mismatch.","");
                ::std::runtime_error::runtime_error(prVar25,(string *)local_1288);
                *(undefined ***)prVar25 = &PTR__runtime_error_0035b0b8;
                __cxa_throw(prVar25,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
              }
            }
            local_1368 = CONCAT71((int7)(CONCAT44(extraout_var,uVar16) >> 8),1);
            pSVar29 = local_1380;
            local_1398 = uVar15;
            local_1394 = uVar16;
          }
          if ((storage == StorageClassOutput) &&
             (bVar13 = Compiler::has_decoration
                                 (&this->super_Compiler,(ID)(pSVar29->super_IVariant).self.id,
                                  DecorationStream), bVar13)) {
            uVar15 = Compiler::get_decoration
                               (&this->super_Compiler,(ID)(pSVar29->super_IVariant).self.id,
                                DecorationStream);
            uVar21 = CONCAT44(extraout_var_00,uVar15);
            if (((local_1388 & 1) != 0) && (local_139c != uVar15)) {
              prVar25 = (runtime_error *)__cxa_allocate_exception(0x10);
              local_1288._0_8_ = local_1288 + 0x10;
              ::std::__cxx11::string::_M_construct<char_const*>
                        ((string *)local_1288,"IO block member Stream mismatch.","");
              ::std::runtime_error::runtime_error(prVar25,(string *)local_1288);
              *(undefined ***)prVar25 = &PTR__runtime_error_0035b0b8;
              __cxa_throw(prVar25,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
            }
LAB_001bd698:
            local_139c = (uint32_t)uVar21;
            local_1388 = CONCAT71((int7)((ulong)uVar21 >> 8),1);
          }
        }
        else if ((!bVar13 && local_1380->storage == storage) &&
                (bVar13 = Compiler::is_builtin_variable(&this->super_Compiler,local_1380), bVar13))
        {
          __k = &(local_1380->super_IVariant).self;
          pmVar19 = ::std::__detail::
                    _Map_base<spirv_cross::TypedID<(spirv_cross::Types)0>,_std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>,_std::__detail::_Select1st,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                    ::operator[](local_1338,__k);
          if ((pmVar19->decoration).builtin == true) {
            local_1374 = (pmVar19->decoration).builtin_type;
            if (local_1374 < 0x40) {
              local_1168 = (pointer)((ulong)local_1168 | 1L << ((byte)local_1374 & 0x3f));
            }
            else {
              local_1288._0_8_ = local_1160;
              ::std::
              _Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
              ::
              _M_insert<unsigned_int_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<unsigned_int,false>>>>
                        ((_Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                          *)local_1288._0_8_,&local_1374,local_1288);
            }
            BVar4 = (pmVar19->decoration).builtin_type;
            if (BVar4 == BuiltInClipDistance) {
              local_1390 = to_array_size_literal
                                     (this,local_1370,
                                      (int)(local_1370->array).super_VectorView<unsigned_int>.
                                           buffer_size - 1);
            }
            else if (BVar4 == BuiltInCullDistance) {
              local_138c = to_array_size_literal
                                     (this,local_1370,
                                      (int)(local_1370->array).super_VectorView<unsigned_int>.
                                           buffer_size - 1);
            }
            BVar4 = (pmVar19->decoration).builtin_type;
            if (((BVar4 < BuiltInVertexId) && (BVar4 != 2)) &&
               ((~(pmVar19->decoration).decoration_flags.lower & 0x3800000000) == 0)) {
              uVar15 = (pmVar19->decoration).offset;
              local_1288._0_4_ = BVar4;
              pmVar20 = ::std::__detail::
                        _Map_base<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                        ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                      *)&local_1320,(key_type *)local_1288);
              *pmVar20 = uVar15;
              uVar15 = (pmVar19->decoration).xfb_buffer;
              uVar16 = (pmVar19->decoration).xfb_stride;
              if ((local_1368 & 1) != 0) {
                if (uVar15 != local_1398) {
                  prVar25 = (runtime_error *)__cxa_allocate_exception(0x10);
                  local_1288._0_8_ = local_1288 + 0x10;
                  ::std::__cxx11::string::_M_construct<char_const*>
                            ((string *)local_1288,"IO block member XfbBuffer mismatch.","");
                  ::std::runtime_error::runtime_error(prVar25,(string *)local_1288);
                  *(undefined ***)prVar25 = &PTR__runtime_error_0035b0b8;
                  __cxa_throw(prVar25,&CompilerError::typeinfo,::std::runtime_error::~runtime_error)
                  ;
                }
                if (uVar16 != local_1394) {
                  prVar25 = (runtime_error *)__cxa_allocate_exception(0x10);
                  local_1288._0_8_ = local_1288 + 0x10;
                  ::std::__cxx11::string::_M_construct<char_const*>
                            ((string *)local_1288,"IO block member XfbBuffer mismatch.","");
                  ::std::runtime_error::runtime_error(prVar25,(string *)local_1288);
                  *(undefined ***)prVar25 = &PTR__runtime_error_0035b0b8;
                  __cxa_throw(prVar25,&CompilerError::typeinfo,::std::runtime_error::~runtime_error)
                  ;
                }
              }
              uVar11 = (uint3)(uVar15 >> 8);
              local_1350 = CONCAT71((uint7)uVar11,1);
              local_1368 = (ulong)CONCAT31(uVar11,1);
              local_1398 = uVar15;
              local_1394 = uVar16;
            }
            BVar4 = (pmVar19->decoration).builtin_type;
            if (((BVar4 < BuiltInVertexId) && (BVar4 != 2)) &&
               (((pmVar19->decoration).decoration_flags.lower & 0x20000000) != 0)) {
              uVar15 = Compiler::get_decoration(&this->super_Compiler,(ID)__k->id,DecorationStream);
              uVar21 = CONCAT44(extraout_var_01,uVar15);
              if (((local_1388 & 1) != 0) && (local_139c != uVar15)) {
                prVar25 = (runtime_error *)__cxa_allocate_exception(0x10);
                local_1288._0_8_ = local_1288 + 0x10;
                ::std::__cxx11::string::_M_construct<char_const*>
                          ((string *)local_1288,"IO block member Stream mismatch.","");
                ::std::runtime_error::runtime_error(prVar25,(string *)local_1288);
                *(undefined ***)prVar25 = &PTR__runtime_error_0035b0b8;
                __cxa_throw(prVar25,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
              }
              goto LAB_001bd698;
            }
          }
        }
        if (local_1110._8_8_ != 0 || local_1128 != (undefined1  [8])0x0) {
          if ((uVar28 & 1) != 0) {
            prVar25 = (runtime_error *)__cxa_allocate_exception(0x10);
            local_1288._0_8_ = local_1288 + 0x10;
            ::std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_1288,"Cannot use more than one builtin I/O block.","");
            ::std::runtime_error::runtime_error(prVar25,(string *)local_1288);
            *(undefined ***)prVar25 = &PTR__runtime_error_0035b0b8;
            __cxa_throw(prVar25,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
          }
          local_12c8 = (pointer)local_1128;
          ::std::
          _Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
          ::
          _M_assign_elements<std::_Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>const&>
                    ((_Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                      *)&local_12c0,
                     (_Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                      *)auStack_1120);
          local_1358 = CONCAT71((int7)((ulong)local_1370 >> 8),
                                (local_1370->array).super_VectorView<unsigned_int>.buffer_size != 0)
          ;
          uVar28 = CONCAT71((int7)(uVar28 >> 8),1);
          local_1360 = local_1380;
        }
        ::std::
        _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
        ::~_Hashtable((_Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                       *)auStack_1120);
        pTVar26 = local_1328;
        pTVar30 = local_1330;
      }
      pTVar26 = pTVar26 + 1;
    } while (pTVar26 != pTVar30);
    bVar32 = (byte)local_1368 & (byte)local_1350 ^ 1;
  }
  ParsedIR::LoopLock::~LoopLock((LoopLock *)&local_12e8);
  local_1168 = (pointer)(ulong)((uint)local_1168 & 0x1b);
  ts_1 = (char *)ap_Stack_10f0;
  auStack_1120._8_8_ = 1;
  local_1110._0_8_ = 0;
  local_1110._8_8_ = 0;
  local_1100 = 1.0;
  local_10f8 = 0;
  ap_Stack_10f0[0] = (__node_base_ptr)0x0;
  local_1128 = (undefined1  [8])local_1168;
  auStack_1120._0_8_ = ts_1;
  ::std::
  _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::_M_move_assign((_Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                    *)local_1160,
                   (_Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                    *)auStack_1120);
  ::std::
  _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable((_Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                 *)auStack_1120);
  SVar35 = local_1378;
  if ((uVar28 & 1) == 0) {
    local_12c8 = local_1168;
    ::std::
    _Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
    ::
    _M_assign_elements<std::_Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>const&>
              ((_Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                *)&local_12c0,
               (_Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                *)local_1160);
  }
  if (local_12c0._M_element_count != 0 || local_12c8 != (pointer)0x0) {
    if (SVar35 == StorageClassOutput) {
      local_1288._0_8_ = local_1270;
      local_1288._8_8_ = 0;
      local_1288._16_8_ = 8;
      if ((bVar32 & 1) == 0) {
        if ((this->options).es != false) {
          prVar25 = (runtime_error *)__cxa_allocate_exception(0x10);
          local_1128 = (undefined1  [8])(auStack_1120 + 8);
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_1128,
                     "Need GL_ARB_enhanced_layouts for xfb_stride or xfb_buffer.","");
          ::std::runtime_error::runtime_error(prVar25,(string *)local_1128);
          *(undefined ***)prVar25 = &PTR__runtime_error_0035b0b8;
          __cxa_throw(prVar25,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
        }
        uVar34 = (this->options).version;
        if (uVar34 - 0x8c < 300) {
          local_1128 = (undefined1  [8])(auStack_1120 + 8);
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_1128,"GL_ARB_enhanced_layouts","");
          require_extension_internal(this,(string *)local_1128);
          if (local_1128 != (undefined1  [8])(auStack_1120 + 8)) {
            operator_delete((void *)local_1128);
          }
        }
        else if (uVar34 < 0x8c) {
          prVar25 = (runtime_error *)__cxa_allocate_exception(0x10);
          local_1128 = (undefined1  [8])(auStack_1120 + 8);
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_1128,
                     "Component decoration is not supported in targets below GLSL 1.40.","");
          ::std::runtime_error::runtime_error(prVar25,(string *)local_1128);
          *(undefined ***)prVar25 = &PTR__runtime_error_0035b0b8;
          __cxa_throw(prVar25,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
        }
        if (((this->options).es == false) && ((this->options).version < 0x1b8)) {
          local_1128 = (undefined1  [8])(auStack_1120 + 8);
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_1128,"GL_ARB_enhanced_layouts","");
          require_extension_internal(this,(string *)local_1128);
          if (local_1128 != (undefined1  [8])(auStack_1120 + 8)) {
            operator_delete((void *)local_1128);
          }
        }
        ts_1 = ", xfb_stride = ";
        join<char_const(&)[14],unsigned_int&,char_const(&)[16],unsigned_int&>
                  ((string *)local_1128,(spirv_cross *)"xfb_buffer = ",(char (*) [14])&local_1398,
                   (uint *)", xfb_stride = ",(char (*) [16])&local_1394,(uint *)in_R9);
        SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
        ::push_back((SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
                     *)local_1288,
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1128)
        ;
        if (local_1128 != (undefined1  [8])(auStack_1120 + 8)) {
          operator_delete((void *)local_1128);
        }
      }
      if ((local_1388 & 1) != 0) {
        EVar17 = Compiler::get_execution_model(&this->super_Compiler);
        if (EVar17 != ExecutionModelGeometry) {
          prVar25 = (runtime_error *)__cxa_allocate_exception(0x10);
          local_1128 = (undefined1  [8])(auStack_1120 + 8);
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_1128,"Geometry streams can only be used in geometry shaders.",
                     "");
          ::std::runtime_error::runtime_error(prVar25,(string *)local_1128);
          *(undefined ***)prVar25 = &PTR__runtime_error_0035b0b8;
          __cxa_throw(prVar25,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
        }
        if ((this->options).es == true) {
          prVar25 = (runtime_error *)__cxa_allocate_exception(0x10);
          local_1128 = (undefined1  [8])(auStack_1120 + 8);
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_1128,"Multiple geometry streams not supported in ESSL.","");
          ::std::runtime_error::runtime_error(prVar25,(string *)local_1128);
          *(undefined ***)prVar25 = &PTR__runtime_error_0035b0b8;
          __cxa_throw(prVar25,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
        }
        if ((this->options).version < 400) {
          local_1128 = (undefined1  [8])(auStack_1120 + 8);
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_1128,"GL_ARB_transform_feedback3","");
          require_extension_internal(this,(string *)local_1128);
          if (local_1128 != (undefined1  [8])(auStack_1120 + 8)) {
            operator_delete((void *)local_1128);
          }
        }
        join<char_const(&)[10],unsigned_int&>
                  ((string *)local_1128,(spirv_cross *)"stream = ",(char (*) [10])&local_139c,
                   (uint *)ts_1);
        SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
        ::push_back((SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
                     *)local_1288,
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1128)
        ;
        if (local_1128 != (undefined1  [8])(auStack_1120 + 8)) {
          operator_delete((void *)local_1128);
        }
      }
      if (local_1288._8_8_ == 0) {
        statement<char_const(&)[17]>(this,(char (*) [17])0x2dfb58);
      }
      else {
        local_110 = local_f8;
        local_1128 = (undefined1  [8])0x0;
        auStack_1120._0_8_ = (__node_base_ptr *)0x0;
        auStack_1120._8_8_ = 0;
        sStack_108 = 0;
        local_100 = 8;
        StringStream<4096UL,_4096UL>::reset((StringStream<4096UL,_4096UL> *)local_1128);
        if (local_1288._8_8_ != 0) {
          pbVar37 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    (local_1288._0_8_ + local_1288._8_8_ * 0x20);
          pbVar33 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    local_1288._0_8_;
          do {
            StringStream<4096UL,_4096UL>::append
                      ((StringStream<4096UL,_4096UL> *)local_1128,(pbVar33->_M_dataplus)._M_p,
                       pbVar33->_M_string_length);
            if (pbVar33 !=
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                (local_1288._0_8_ + (local_1288._8_8_ - 1) * 0x20)) {
              StringStream<4096UL,_4096UL>::append
                        ((StringStream<4096UL,_4096UL> *)local_1128,", ",2);
            }
            pbVar33 = pbVar33 + 1;
          } while (pbVar33 != pbVar37);
        }
        StringStream<4096ul,4096ul>::str_abi_cxx11_(&local_12e8,local_1128);
        StringStream<4096UL,_4096UL>::~StringStream((StringStream<4096UL,_4096UL> *)local_1128);
        statement<char_const(&)[8],std::__cxx11::string,char_const(&)[19]>
                  (this,(char (*) [8])"layout(",&local_12e8,(char (*) [19])") out gl_PerVertex");
        SVar35 = local_1378;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_12e8._M_dataplus._M_p != &local_12e8.field_2) {
          operator_delete(local_12e8._M_dataplus._M_p);
        }
      }
      SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
      ::~SmallVector((SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
                      *)local_1288);
    }
    else {
      pSVar24 = Compiler::get_entry_point(&this->super_Compiler);
      if (pSVar24->geometry_passthrough == true) {
        statement<char_const(&)[36]>(this,(char (*) [36])"layout(passthrough) in gl_PerVertex");
      }
      else {
        statement<char_const(&)[16]>(this,(char (*) [16])0x2dfb7d);
      }
    }
    statement<char_const(&)[2]>(this,(char (*) [2])"{");
    this->indent = this->indent + 1;
    if (((ulong)local_12c8 & 1) != 0) {
      p_Var31 = *local_1320._M_buckets;
      if (p_Var31 == (__node_base_ptr)0x0) {
LAB_001bdc0a:
        p_Var22 = (_Hash_node_base *)0x0;
      }
      else {
        uVar34 = *(uint *)&p_Var31->_M_nxt[1]._M_nxt;
        p_Var27 = p_Var31->_M_nxt;
        do {
          p_Var22 = p_Var31;
          if (uVar34 == 0) break;
          p_Var8 = p_Var27->_M_nxt;
          if (p_Var8 == (_Hash_node_base *)0x0) goto LAB_001bdc0a;
          uVar34 = *(uint *)&p_Var8[1]._M_nxt;
          p_Var22 = (_Hash_node_base *)0x0;
          p_Var31 = p_Var27;
          p_Var27 = p_Var8;
        } while ((ulong)uVar34 % local_1320._M_bucket_count == 0);
      }
      if (p_Var22 == (_Hash_node_base *)0x0) {
        p_Var27 = (_Hash_node_base *)0x0;
      }
      else {
        p_Var27 = p_Var22->_M_nxt;
      }
      if (p_Var27 == (_Hash_node_base *)0x0) {
        statement<char_const(&)[18]>(this,(char (*) [18])0x2dfba4);
      }
      else {
        statement<char_const(&)[21],unsigned_int&,char_const(&)[20]>
                  (this,(char (*) [21])"layout(xfb_offset = ",(uint *)((long)&p_Var27[1]._M_nxt + 4)
                   ,(char (*) [20])") vec4 gl_Position;");
      }
    }
    if (((ulong)local_12c8 & 2) != 0) {
      p_Var31 = local_1320._M_buckets[local_1320._M_bucket_count != 1];
      if (p_Var31 == (__node_base_ptr)0x0) {
LAB_001bdcad:
        p_Var23 = (__node_base_ptr)0x0;
        p_Var12 = in_R9;
      }
      else {
        uVar34 = *(uint *)&p_Var31->_M_nxt[1]._M_nxt;
        p_Var27 = p_Var31->_M_nxt;
        p_Var12 = in_R9;
        do {
          in_R9 = p_Var27;
          p_Var23 = p_Var31;
          if (uVar34 == 1) break;
          p_Var27 = in_R9->_M_nxt;
          if (p_Var27 == (_Hash_node_base *)0x0) goto LAB_001bdcad;
          uVar34 = *(uint *)&p_Var27[1]._M_nxt;
          p_Var23 = (__node_base_ptr)0x0;
          p_Var12 = in_R9;
          p_Var31 = in_R9;
        } while ((uint)((ulong)uVar34 % local_1320._M_bucket_count) ==
                 (uint)(local_1320._M_bucket_count != 1));
      }
      in_R9 = p_Var12;
      if (p_Var23 == (__node_base_ptr)0x0) {
        p_Var27 = (_Hash_node_base *)0x0;
      }
      else {
        p_Var27 = p_Var23->_M_nxt;
      }
      if (p_Var27 == (_Hash_node_base *)0x0) {
        statement<char_const(&)[20]>(this,(char (*) [20])0x2dfbb8);
      }
      else {
        statement<char_const(&)[21],unsigned_int&,char_const(&)[22]>
                  (this,(char (*) [21])"layout(xfb_offset = ",(uint *)((long)&p_Var27[1]._M_nxt + 4)
                   ,(char (*) [22])") float gl_PointSize;");
      }
    }
    if (((ulong)local_12c8 & 8) != 0) {
      auVar9._8_8_ = 0;
      auVar9._0_8_ = local_1320._M_bucket_count;
      uVar28 = SUB168((ZEXT816(0) << 0x40 | ZEXT816(3)) % auVar9,0);
      p_Var31 = local_1320._M_buckets[uVar28 & 0xffffffff];
      in_R9 = (__node_base_ptr)0x0;
      if ((p_Var31 != (__node_base_ptr)0x0) &&
         (p_Var27 = p_Var31->_M_nxt, in_R9 = p_Var31, *(int *)&p_Var31->_M_nxt[1]._M_nxt != 3)) {
        while (p_Var22 = p_Var27, p_Var27 = p_Var22->_M_nxt, p_Var27 != (_Hash_node_base *)0x0) {
          in_R9 = (__node_base_ptr)0x0;
          if (((ulong)*(uint *)&p_Var27[1]._M_nxt % local_1320._M_bucket_count != uVar28) ||
             (in_R9 = p_Var22, *(uint *)&p_Var27[1]._M_nxt == 3)) goto LAB_001bdd60;
        }
        in_R9 = (__node_base_ptr)0x0;
      }
LAB_001bdd60:
      if (in_R9 == (__node_base_ptr)0x0) {
        p_Var27 = (_Hash_node_base *)0x0;
      }
      else {
        p_Var27 = in_R9->_M_nxt;
      }
      if (p_Var27 == (_Hash_node_base *)0x0) {
        statement<char_const(&)[23],unsigned_int&,char_const(&)[3]>
                  (this,(char (*) [23])0x2dfbce,&local_1390,(char (*) [3])0x2e64cb);
      }
      else {
        in_R9 = (__node_base_ptr)0x2e64cb;
        statement<char_const(&)[21],unsigned_int&,char_const(&)[25],unsigned_int&,char_const(&)[3]>
                  (this,(char (*) [21])"layout(xfb_offset = ",(uint *)((long)&p_Var27[1]._M_nxt + 4)
                   ,(char (*) [25])") float gl_ClipDistance[",&local_1390,(char (*) [3])0x2e64cb);
      }
    }
    if (((ulong)local_12c8 & 0x10) != 0) {
      auVar10._8_8_ = 0;
      auVar10._0_8_ = local_1320._M_bucket_count;
      uVar28 = SUB168((ZEXT816(0) << 0x40 | ZEXT816(4)) % auVar10,0);
      p_Var31 = local_1320._M_buckets[uVar28 & 0xffffffff];
      in_R9 = (__node_base_ptr)0x0;
      if ((p_Var31 != (__node_base_ptr)0x0) &&
         (p_Var27 = p_Var31->_M_nxt, in_R9 = p_Var31, *(int *)&p_Var31->_M_nxt[1]._M_nxt != 4)) {
        while (p_Var31 = p_Var27, p_Var27 = p_Var31->_M_nxt, p_Var27 != (_Hash_node_base *)0x0) {
          in_R9 = (__node_base_ptr)0x0;
          if (((ulong)*(uint *)&p_Var27[1]._M_nxt % local_1320._M_bucket_count != uVar28) ||
             (in_R9 = p_Var31, *(uint *)&p_Var27[1]._M_nxt == 4)) goto LAB_001bde29;
        }
        in_R9 = (__node_base_ptr)0x0;
      }
LAB_001bde29:
      if (in_R9 == (__node_base_ptr)0x0) {
        p_Var27 = (_Hash_node_base *)0x0;
      }
      else {
        p_Var27 = in_R9->_M_nxt;
      }
      if (p_Var27 == (_Hash_node_base *)0x0) {
        statement<char_const(&)[23],unsigned_int&,char_const(&)[3]>
                  (this,(char (*) [23])0x2dfbe7,&local_138c,(char (*) [3])0x2e64cb);
      }
      else {
        in_R9 = (__node_base_ptr)0x2e64cb;
        statement<char_const(&)[21],unsigned_int&,char_const(&)[25],unsigned_int&,char_const(&)[3]>
                  (this,(char (*) [21])"layout(xfb_offset = ",(uint *)((long)&p_Var27[1]._M_nxt + 4)
                   ,(char (*) [25])") float gl_CullDistance[",&local_138c,(char (*) [3])0x2e64cb);
      }
    }
    if ((local_1358 & 1) == 0) {
      end_scope_decl(this);
    }
    else {
      if (local_1344 == ExecutionModelTessellationControl && SVar35 == StorageClassOutput) {
        (*(this->super_Compiler)._vptr_Compiler[6])
                  (local_1288,this,(ulong)(local_1360->super_IVariant).self.id,1);
        pSVar24 = Compiler::get_entry_point(&this->super_Compiler);
        join<std::__cxx11::string,char_const(&)[2],unsigned_int&,char_const(&)[2]>
                  ((string *)local_1128,(spirv_cross *)local_1288,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x2f570e,
                   (char (*) [2])&pSVar24->output_vertices,(uint *)0x2e790f,(char (*) [2])in_R9);
        end_scope_decl(this,(string *)local_1128);
      }
      else {
        ts_1_00 = (char (*) [3])0x1;
        (*(this->super_Compiler)._vptr_Compiler[6])
                  (local_1288,this,(ulong)(local_1360->super_IVariant).self.id);
        join<std::__cxx11::string,char_const(&)[3]>
                  ((string *)local_1128,(spirv_cross *)local_1288,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)"[]",ts_1_00
                  );
        end_scope_decl(this,(string *)local_1128);
      }
      if (local_1128 != (undefined1  [8])(auStack_1120 + 8)) {
        operator_delete((void *)local_1128);
      }
      if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1288._0_8_ !=
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(local_1288 + 0x10))
      {
        operator_delete((void *)local_1288._0_8_);
      }
    }
    statement<char_const(&)[1]>(this,(char (*) [1])0x2dc0a8);
  }
  ::std::
  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable(&local_1320);
  ::std::
  _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable((_Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                 *)local_1160);
  ::std::
  _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable(&local_12c0);
  return;
}

Assistant:

void CompilerGLSL::emit_declared_builtin_block(StorageClass storage, ExecutionModel model)
{
	Bitset emitted_builtins;
	Bitset global_builtins;
	const SPIRVariable *block_var = nullptr;
	bool emitted_block = false;
	bool builtin_array = false;

	// Need to use declared size in the type.
	// These variables might have been declared, but not statically used, so we haven't deduced their size yet.
	uint32_t cull_distance_size = 0;
	uint32_t clip_distance_size = 0;

	bool have_xfb_buffer_stride = false;
	bool have_geom_stream = false;
	bool have_any_xfb_offset = false;
	uint32_t xfb_stride = 0, xfb_buffer = 0, geom_stream = 0;
	std::unordered_map<uint32_t, uint32_t> builtin_xfb_offsets;

	ir.for_each_typed_id<SPIRVariable>([&](uint32_t, SPIRVariable &var) {
		auto &type = this->get<SPIRType>(var.basetype);
		bool block = has_decoration(type.self, DecorationBlock);
		Bitset builtins;

		if (var.storage == storage && block && is_builtin_variable(var))
		{
			uint32_t index = 0;
			for (auto &m : ir.meta[type.self].members)
			{
				if (m.builtin)
				{
					builtins.set(m.builtin_type);
					if (m.builtin_type == BuiltInCullDistance)
						cull_distance_size = to_array_size_literal(this->get<SPIRType>(type.member_types[index]));
					else if (m.builtin_type == BuiltInClipDistance)
						clip_distance_size = to_array_size_literal(this->get<SPIRType>(type.member_types[index]));

					if (is_block_builtin(m.builtin_type) && m.decoration_flags.get(DecorationOffset))
					{
						have_any_xfb_offset = true;
						builtin_xfb_offsets[m.builtin_type] = m.offset;
					}

					if (is_block_builtin(m.builtin_type) && m.decoration_flags.get(DecorationStream))
					{
						uint32_t stream = m.stream;
						if (have_geom_stream && geom_stream != stream)
							SPIRV_CROSS_THROW("IO block member Stream mismatch.");
						have_geom_stream = true;
						geom_stream = stream;
					}
				}
				index++;
			}

			if (storage == StorageClassOutput && has_decoration(var.self, DecorationXfbBuffer) &&
			    has_decoration(var.self, DecorationXfbStride))
			{
				uint32_t buffer_index = get_decoration(var.self, DecorationXfbBuffer);
				uint32_t stride = get_decoration(var.self, DecorationXfbStride);
				if (have_xfb_buffer_stride && buffer_index != xfb_buffer)
					SPIRV_CROSS_THROW("IO block member XfbBuffer mismatch.");
				if (have_xfb_buffer_stride && stride != xfb_stride)
					SPIRV_CROSS_THROW("IO block member XfbBuffer mismatch.");
				have_xfb_buffer_stride = true;
				xfb_buffer = buffer_index;
				xfb_stride = stride;
			}

			if (storage == StorageClassOutput && has_decoration(var.self, DecorationStream))
			{
				uint32_t stream = get_decoration(var.self, DecorationStream);
				if (have_geom_stream && geom_stream != stream)
					SPIRV_CROSS_THROW("IO block member Stream mismatch.");
				have_geom_stream = true;
				geom_stream = stream;
			}
		}
		else if (var.storage == storage && !block && is_builtin_variable(var))
		{
			// While we're at it, collect all declared global builtins (HLSL mostly ...).
			auto &m = ir.meta[var.self].decoration;
			if (m.builtin)
			{
				global_builtins.set(m.builtin_type);
				if (m.builtin_type == BuiltInCullDistance)
					cull_distance_size = to_array_size_literal(type);
				else if (m.builtin_type == BuiltInClipDistance)
					clip_distance_size = to_array_size_literal(type);

				if (is_block_builtin(m.builtin_type) && m.decoration_flags.get(DecorationXfbStride) &&
				    m.decoration_flags.get(DecorationXfbBuffer) && m.decoration_flags.get(DecorationOffset))
				{
					have_any_xfb_offset = true;
					builtin_xfb_offsets[m.builtin_type] = m.offset;
					uint32_t buffer_index = m.xfb_buffer;
					uint32_t stride = m.xfb_stride;
					if (have_xfb_buffer_stride && buffer_index != xfb_buffer)
						SPIRV_CROSS_THROW("IO block member XfbBuffer mismatch.");
					if (have_xfb_buffer_stride && stride != xfb_stride)
						SPIRV_CROSS_THROW("IO block member XfbBuffer mismatch.");
					have_xfb_buffer_stride = true;
					xfb_buffer = buffer_index;
					xfb_stride = stride;
				}

				if (is_block_builtin(m.builtin_type) && m.decoration_flags.get(DecorationStream))
				{
					uint32_t stream = get_decoration(var.self, DecorationStream);
					if (have_geom_stream && geom_stream != stream)
						SPIRV_CROSS_THROW("IO block member Stream mismatch.");
					have_geom_stream = true;
					geom_stream = stream;
				}
			}
		}

		if (builtins.empty())
			return;

		if (emitted_block)
			SPIRV_CROSS_THROW("Cannot use more than one builtin I/O block.");

		emitted_builtins = builtins;
		emitted_block = true;
		builtin_array = !type.array.empty();
		block_var = &var;
	});

	global_builtins =
	    Bitset(global_builtins.get_lower() & ((1ull << BuiltInPosition) | (1ull << BuiltInPointSize) |
	                                          (1ull << BuiltInClipDistance) | (1ull << BuiltInCullDistance)));

	// Try to collect all other declared builtins.
	if (!emitted_block)
		emitted_builtins = global_builtins;

	// Can't declare an empty interface block.
	if (emitted_builtins.empty())
		return;

	if (storage == StorageClassOutput)
	{
		SmallVector<string> attr;
		if (have_xfb_buffer_stride && have_any_xfb_offset)
		{
			if (!options.es)
			{
				if (options.version < 440 && options.version >= 140)
					require_extension_internal("GL_ARB_enhanced_layouts");
				else if (options.version < 140)
					SPIRV_CROSS_THROW("Component decoration is not supported in targets below GLSL 1.40.");
				if (!options.es && options.version < 440)
					require_extension_internal("GL_ARB_enhanced_layouts");
			}
			else if (options.es)
				SPIRV_CROSS_THROW("Need GL_ARB_enhanced_layouts for xfb_stride or xfb_buffer.");
			attr.push_back(join("xfb_buffer = ", xfb_buffer, ", xfb_stride = ", xfb_stride));
		}

		if (have_geom_stream)
		{
			if (get_execution_model() != ExecutionModelGeometry)
				SPIRV_CROSS_THROW("Geometry streams can only be used in geometry shaders.");
			if (options.es)
				SPIRV_CROSS_THROW("Multiple geometry streams not supported in ESSL.");
			if (options.version < 400)
				require_extension_internal("GL_ARB_transform_feedback3");
			attr.push_back(join("stream = ", geom_stream));
		}

		if (!attr.empty())
			statement("layout(", merge(attr), ") out gl_PerVertex");
		else
			statement("out gl_PerVertex");
	}
	else
	{
		// If we have passthrough, there is no way PerVertex cannot be passthrough.
		if (get_entry_point().geometry_passthrough)
			statement("layout(passthrough) in gl_PerVertex");
		else
			statement("in gl_PerVertex");
	}

	begin_scope();
	if (emitted_builtins.get(BuiltInPosition))
	{
		auto itr = builtin_xfb_offsets.find(BuiltInPosition);
		if (itr != end(builtin_xfb_offsets))
			statement("layout(xfb_offset = ", itr->second, ") vec4 gl_Position;");
		else
			statement("vec4 gl_Position;");
	}

	if (emitted_builtins.get(BuiltInPointSize))
	{
		auto itr = builtin_xfb_offsets.find(BuiltInPointSize);
		if (itr != end(builtin_xfb_offsets))
			statement("layout(xfb_offset = ", itr->second, ") float gl_PointSize;");
		else
			statement("float gl_PointSize;");
	}

	if (emitted_builtins.get(BuiltInClipDistance))
	{
		auto itr = builtin_xfb_offsets.find(BuiltInClipDistance);
		if (itr != end(builtin_xfb_offsets))
			statement("layout(xfb_offset = ", itr->second, ") float gl_ClipDistance[", clip_distance_size, "];");
		else
			statement("float gl_ClipDistance[", clip_distance_size, "];");
	}

	if (emitted_builtins.get(BuiltInCullDistance))
	{
		auto itr = builtin_xfb_offsets.find(BuiltInCullDistance);
		if (itr != end(builtin_xfb_offsets))
			statement("layout(xfb_offset = ", itr->second, ") float gl_CullDistance[", cull_distance_size, "];");
		else
			statement("float gl_CullDistance[", cull_distance_size, "];");
	}

	if (builtin_array)
	{
		if (model == ExecutionModelTessellationControl && storage == StorageClassOutput)
			end_scope_decl(join(to_name(block_var->self), "[", get_entry_point().output_vertices, "]"));
		else
			end_scope_decl(join(to_name(block_var->self), "[]"));
	}
	else
		end_scope_decl();
	statement("");
}